

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testLimits.cpp
# Opt level: O0

float anon_unknown.dwarf_c3ad1::mypow(int x,int y)

{
  float z;
  bool negative;
  int y_local;
  int x_local;
  
  y_local = y;
  if (y < 0) {
    y_local = -y;
  }
  z = 1.0;
  for (; 0 < y_local; y_local = y_local + -1) {
    z = (float)x * z;
  }
  if (y < 0) {
    z = 1.0 / z;
  }
  return z;
}

Assistant:

float
mypow (int x, int y)
{
    bool negative = false;

    if (y < 0)
    {
        negative = true;
        y        = -y;
    }

    float z = 1;

    while (y > 0)
    {
        z *= x;
        y -= 1;
    }

    if (negative) z = 1 / z;

    return z;
}